

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O3

int Nwk_ManCompareAndSaveBest(Nwk_Man_t *pNtk,void *pNtl)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *__dest;
  
  if (pNtk == (Nwk_Man_t *)0x0) {
    iVar2 = 0;
    if (Nwk_ManCompareAndSaveBest_ParsBest_0 != (char *)0x0) {
      free(Nwk_ManCompareAndSaveBest_ParsBest_0);
      Nwk_ManCompareAndSaveBest_ParsBest_0 = (char *)0x0;
    }
  }
  else {
    Nwk_ManCompareAndSaveBest_ParsNew_0 = Nwk_ManLevel(pNtk);
    Nwk_ManCompareAndSaveBest_ParsNew_1 = pNtk->nObjs[4];
    Nwk_ManCompareAndSaveBest_ParsNew_2 = pNtk->nObjs[3];
    Nwk_ManPiNum(pNtk);
    Nwk_ManPoNum(pNtk);
    pcVar1 = Nwk_ManCompareAndSaveBest_ParsBest_0;
    if (Nwk_ManCompareAndSaveBest_ParsBest_0 != (char *)0x0) {
      iVar2 = strcmp(Nwk_ManCompareAndSaveBest_ParsBest_0,pNtk->pName);
      if ((iVar2 == 0) &&
         (Nwk_ManCompareAndSaveBest_ParsBest_1 <= Nwk_ManCompareAndSaveBest_ParsNew_0)) {
        if (Nwk_ManCompareAndSaveBest_ParsBest_1 != Nwk_ManCompareAndSaveBest_ParsNew_0) {
          return 0;
        }
        if (Nwk_ManCompareAndSaveBest_ParsBest_2 <= Nwk_ManCompareAndSaveBest_ParsNew_1) {
          if (Nwk_ManCompareAndSaveBest_ParsBest_2 != Nwk_ManCompareAndSaveBest_ParsNew_1) {
            return 0;
          }
          if (Nwk_ManCompareAndSaveBest_ParsBest_3 <= Nwk_ManCompareAndSaveBest_ParsNew_2) {
            return 0;
          }
        }
      }
      free(pcVar1);
    }
    pcVar1 = pNtk->pName;
    if (pcVar1 == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(pcVar1);
      __dest = (char *)malloc(sVar3 + 1);
      strcpy(__dest,pcVar1);
    }
    Nwk_ManCompareAndSaveBest_ParsBest_1 = Nwk_ManCompareAndSaveBest_ParsNew_0;
    Nwk_ManCompareAndSaveBest_ParsBest_2 = Nwk_ManCompareAndSaveBest_ParsNew_1;
    Nwk_ManCompareAndSaveBest_ParsBest_3 = Nwk_ManCompareAndSaveBest_ParsNew_2;
    iVar2 = 1;
    Nwk_ManCompareAndSaveBest_ParsBest_0 = __dest;
  }
  return iVar2;
}

Assistant:

int Nwk_ManCompareAndSaveBest( Nwk_Man_t * pNtk, void * pNtl )
{
//    extern void Ntl_WriteBlifLogic( Nwk_Man_t * pNtk, void * pNtl, char * pFileName );
    extern void Nwk_ManDumpBlif( Nwk_Man_t * pNtk, char * pFileName, Vec_Ptr_t * vPiNames, Vec_Ptr_t * vPoNames );
    static struct ParStruct {
        char * pName;  // name of the best saved network
        int    Depth;  // depth of the best saved network
        int    Flops;  // flops in the best saved network 
        int    Nodes;  // nodes in the best saved network
        int    nPis;   // the number of primary inputs
        int    nPos;   // the number of primary outputs
    } ParsNew, ParsBest = { 0 };
    // free storage for the name
    if ( pNtk == NULL )
    {
        ABC_FREE( ParsBest.pName );
        return 0;
    }
    // get the parameters
    ParsNew.Depth = Nwk_ManLevel( pNtk );
    ParsNew.Flops = Nwk_ManLatchNum( pNtk );
    ParsNew.Nodes = Nwk_ManNodeNum( pNtk );
    ParsNew.nPis  = Nwk_ManPiNum( pNtk );
    ParsNew.nPos  = Nwk_ManPoNum( pNtk );
    // reset the parameters if the network has the same name
    if (  ParsBest.pName == NULL ||
          strcmp(ParsBest.pName, pNtk->pName) ||
          ParsBest.Depth >  ParsNew.Depth ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops >  ParsNew.Flops) ||
         (ParsBest.Depth == ParsNew.Depth && ParsBest.Flops == ParsNew.Flops && ParsBest.Nodes >  ParsNew.Nodes) )
    {
        ABC_FREE( ParsBest.pName );
        ParsBest.pName = Abc_UtilStrsav( pNtk->pName );
        ParsBest.Depth = ParsNew.Depth; 
        ParsBest.Flops = ParsNew.Flops; 
        ParsBest.Nodes = ParsNew.Nodes; 
        ParsBest.nPis  = ParsNew.nPis; 
        ParsBest.nPos  = ParsNew.nPos;
        // write the network
//        Ntl_WriteBlifLogic( pNtk, pNtl, "best.blif" );
//        Nwk_ManDumpBlif( pNtk, "best_map.blif", NULL, NULL );
        return 1;
    }
    return 0;
}